

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall
MPLSStreamInfo::composeStreamAttributes(MPLSStreamInfo *this,BitStreamWriter *writer)

{
  StreamType stream_coding_type;
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ostringstream ss;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint *local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  uint *local_1b0;
  ostringstream local_1a8 [376];
  
  puVar2 = (writer->super_BitStream).m_buffer;
  local_1b0 = (writer->super_BitStream).m_initBuffer;
  local_1b8 = (ulong)writer->m_bitWrited;
  BitStreamWriter::putBits(writer,8,0);
  puVar3 = (writer->super_BitStream).m_buffer;
  local_1c8 = (writer->super_BitStream).m_initBuffer;
  local_1c0 = (ulong)writer->m_bitWrited;
  BitStreamWriter::putBits(writer,8,(this->super_M2TSStreamInfo).stream_coding_type);
  stream_coding_type = (this->super_M2TSStreamInfo).stream_coding_type;
  bVar4 = isVideoStreamType(stream_coding_type);
  if (bVar4) {
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).video_format);
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).frame_rate_index);
    uVar1 = (this->super_M2TSStreamInfo).HDR;
    uVar5 = 0;
    if (uVar1 == 4) {
      uVar5 = 0x22;
    }
    uVar8 = 0x12;
    if ((uVar1 & 0x12) == 0) {
      uVar8 = uVar5;
    }
    BitStreamWriter::putBits(writer,8,uVar8);
    BitStreamWriter::putBits(writer,8,(uint)((this->super_M2TSStreamInfo).HDR == 0x10) << 6);
  }
  else {
    bVar4 = isAudioStreamType(stream_coding_type);
    if (bVar4) {
      BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).audio_presentation_type);
      BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).sampling_frequency_index)
      ;
      lVar10 = -3;
      do {
        BitStreamWriter::putBits
                  (writer,8,(int)(this->super_M2TSStreamInfo).language_code[lVar10 + 3]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0);
      goto LAB_001e5349;
    }
    if (stream_coding_type != SUB_PGS) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Unsupported media type for AVCHD/Blu-ray muxing",0x2f);
      puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar7 = 3;
      *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
      if (local_1e8 == &local_1d8) {
        puVar7[6] = local_1d8;
        puVar7[7] = uStack_1d4;
        puVar7[8] = uStack_1d0;
        puVar7[9] = uStack_1cc;
      }
      else {
        *(uint **)(puVar7 + 2) = local_1e8;
        *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1d4,local_1d8);
      }
      *(undefined8 *)(puVar7 + 4) = local_1e0;
      local_1d8 = local_1d8 & 0xffffff00;
      __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    lVar10 = -3;
    do {
      BitStreamWriter::putBits(writer,8,(int)(this->super_M2TSStreamInfo).language_code[lVar10 + 3])
      ;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0);
  }
  BitStreamWriter::putBits(writer,8,0);
LAB_001e5349:
  local_1c8._0_4_ = (int)puVar3 - (int)local_1c8;
  uVar5 = (int)local_1c0 + (int)local_1c8 * 8;
  iVar9 = (int)puVar2 - (int)local_1b0;
  uVar1 = (int)local_1c0 + (int)local_1c8 * 8 + 7;
  if (-1 < (int)uVar5) {
    uVar1 = uVar5;
  }
  iVar6 = (int)local_1b8 + iVar9 * 8;
  iVar9 = (int)local_1b8 + iVar9 * 8 + 7;
  if (-1 < iVar6) {
    iVar9 = iVar6;
  }
  iVar6 = *(int *)&(writer->super_BitStream).m_buffer -
          *(int *)&(writer->super_BitStream).m_initBuffer;
  uVar5 = writer->m_bitWrited + iVar6 * 8;
  uVar8 = writer->m_bitWrited + iVar6 * 8 + 7;
  if (-1 < (int)uVar5) {
    uVar8 = uVar5;
  }
  *(char *)((long)local_1b0 + (long)(iVar9 >> 3)) = (char)(uVar8 >> 3) - (char)(uVar1 >> 3);
  return;
}

Assistant:

void MPLSStreamInfo::composeStreamAttributes(BitStreamWriter& writer)
{
    uint8_t* lengthPos = writer.getBuffer() + writer.getBitsCount() / 8;
    writer.putBits(8, 0);  // length
    const int initPos = writer.getBitsCount() / 8;

    writer.putBits(8, static_cast<int>(stream_coding_type));
    if (isVideoStreamType(stream_coding_type))
    {
        writer.putBits(4, video_format);
        writer.putBits(4, frame_rate_index);
        if (HDR & 18)
            writer.putBits(8, 0x12);  // HDR10 or HDR10plus
        else if (HDR == 4)
            writer.putBits(8, 0x22);  // DV
        else
            writer.putBits(8, 0);
        if (HDR == 16)
            writer.putBits(8, 0x40);  // HDR10plus
        else
            writer.putBits(8, 0);
        writer.putBits(8, 0);  // reserved_for_future_use
    }
    else if (isAudioStreamType(stream_coding_type))
    {
        writer.putBits(4, audio_presentation_type);
        writer.putBits(4, sampling_frequency_index);
        CLPIStreamInfo::writeString(language_code, writer, 3);
    }
    else if (stream_coding_type == StreamType::SUB_PGS)
    {
        // Presentation Graphics stream
        CLPIStreamInfo::writeString(language_code, writer, 3);
        writer.putBits(8, 0);  // reserved_for_future_use
    }
    else
        THROW(ERR_COMMON, "Unsupported media type for AVCHD/Blu-ray muxing")
    *lengthPos = static_cast<uint8_t>(writer.getBitsCount() / 8 - initPos);
}